

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall ON_MappingRef::Compare(ON_MappingRef *this,ON_MappingRef *other)

{
  int iVar1;
  int iVar2;
  ON_MappingChannel *this_00;
  ON_MappingChannel *other_00;
  int local_24;
  int i;
  int count;
  int rc;
  ON_MappingRef *other_local;
  ON_MappingRef *this_local;
  
  i = ON_UuidCompare(&this->m_plugin_id,&other->m_plugin_id);
  if (i == 0) {
    iVar1 = ON_SimpleArray<ON_MappingChannel>::Count(&this->m_mapping_channels);
    iVar2 = ON_SimpleArray<ON_MappingChannel>::Count(&other->m_mapping_channels);
    i = iVar1 - iVar2;
    if (i == 0) {
      for (local_24 = 0; local_24 < iVar1 && i == 0; local_24 = local_24 + 1) {
        this_00 = ON_SimpleArray<ON_MappingChannel>::operator[](&this->m_mapping_channels,local_24);
        other_00 = ON_SimpleArray<ON_MappingChannel>::operator[]
                             (&other->m_mapping_channels,local_24);
        i = ON_MappingChannel::Compare(this_00,other_00);
      }
    }
  }
  return i;
}

Assistant:

int ON_MappingRef::Compare( const ON_MappingRef& other ) const
{
  int rc = ON_UuidCompare(m_plugin_id,other.m_plugin_id);
  if ( !rc)
  {
    const int count = m_mapping_channels.Count();
    rc = count - other.m_mapping_channels.Count();
    if (!rc)
    {
      for ( int i = 0; i < count && !rc; i++ )
      {
        rc = m_mapping_channels[i].Compare(other.m_mapping_channels[i]);
      }
    }
  }
  return rc;
}